

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void nonce_function_bip340_bitflip
               (uchar **args,size_t n_flip,size_t n_bytes,size_t msglen,size_t algolen)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  uchar nonces [2] [32];
  
  iVar1 = nonce_function_bip340(nonces[0],*args,0x20,args[1],args[2],args[3],0xd,args[4]);
  if (iVar1 == 0) {
    pcVar2 = 
    "test condition failed: nonce_function_bip340(nonces[0], args[0], msglen, args[1], args[2], args[3], algolen, args[4]) == 1"
    ;
    uVar3 = 0x11;
  }
  else {
    testrand_flip(args[n_flip],n_bytes);
    iVar1 = nonce_function_bip340(nonces[1],*args,0x20,args[1],args[2],args[3],0xd,args[4]);
    if (iVar1 == 0) {
      pcVar2 = 
      "test condition failed: nonce_function_bip340(nonces[1], args[0], msglen, args[1], args[2], args[3], algolen, args[4]) == 1"
      ;
      uVar3 = 0x13;
    }
    else {
      iVar1 = secp256k1_memcmp_var(nonces,nonces + 1,0x20);
      if (iVar1 != 0) {
        return;
      }
      pcVar2 = "test condition failed: secp256k1_memcmp_var(nonces[0], nonces[1], 32) != 0";
      uVar3 = 0x14;
    }
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
          ,uVar3,pcVar2);
  abort();
}

Assistant:

static void nonce_function_bip340_bitflip(unsigned char **args, size_t n_flip, size_t n_bytes, size_t msglen, size_t algolen) {
    unsigned char nonces[2][32];
    CHECK(nonce_function_bip340(nonces[0], args[0], msglen, args[1], args[2], args[3], algolen, args[4]) == 1);
    testrand_flip(args[n_flip], n_bytes);
    CHECK(nonce_function_bip340(nonces[1], args[0], msglen, args[1], args[2], args[3], algolen, args[4]) == 1);
    CHECK(secp256k1_memcmp_var(nonces[0], nonces[1], 32) != 0);
}